

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O1

void anon_unknown.dwarf_2fe11b::fillPixelsColor(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  short sVar1;
  Rgba *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  unsigned_short uVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  ulong local_68;
  long local_60;
  
  if (0 < h) {
    local_60 = 0;
    local_68 = 0;
    do {
      if (0 < w) {
        dVar3 = (double)(int)local_68;
        uVar7 = 0;
        do {
          lVar8 = pixels->_sizeY;
          pRVar2 = pixels->_data;
          dVar4 = (double)(int)uVar7;
          dVar5 = sin(dVar4 * 0.05);
          fVar9 = (float)(dVar5 * 0.5 + 0.8);
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          lVar8 = lVar8 * local_60;
          *(unsigned_short *)((long)&pRVar2[uVar7].r._h + lVar8) = uVar6;
          dVar5 = sin(dVar4 * 0.02 + dVar3 * 0.02);
          fVar9 = (float)(dVar5 * 0.5 + 0.8);
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].g._h + lVar8) = uVar6;
          dVar5 = sin(dVar3 * 0.03);
          fVar9 = (float)(dVar5 * 0.5 + 0.8);
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].b._h + lVar8) = uVar6;
          dVar4 = sin(dVar4 * 0.05 + dVar3 * -0.05);
          fVar10 = (float)(dVar4 * 0.5 + 0.8);
          fVar9 = *(float *)((long)&half::_toFloat +
                            (ulong)*(unsigned_short *)((long)&pRVar2[uVar7].r._h + lVar8) * 4) *
                  fVar10;
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].r._h + lVar8) = uVar6;
          fVar9 = *(float *)((long)&half::_toFloat +
                            (ulong)*(unsigned_short *)((long)&pRVar2[uVar7].g._h + lVar8) * 4) *
                  fVar10;
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].g._h + lVar8) = uVar6;
          fVar9 = *(float *)((long)&half::_toFloat +
                            (ulong)*(unsigned_short *)((long)&pRVar2[uVar7].b._h + lVar8) * 4) *
                  fVar10;
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar9);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].b._h + lVar8) = uVar6;
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar10);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar10 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar7].a._h + lVar8) = uVar6;
          uVar7 = uVar7 + 1;
        } while ((uint)w != uVar7);
      }
      local_68 = local_68 + 1;
      local_60 = local_60 + 8;
    } while (local_68 != (uint)h);
  }
  return;
}

Assistant:

void
fillPixelsColor (Array2D <Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = 0.8 + 0.5 * sin (x * 0.05);
	    p.g = 0.8 + 0.5 * sin (x * 0.02 + y * 0.02);
	    p.b = 0.8 + 0.5 * sin (y * 0.03);

	    float t = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);

	    p.r *= t;
	    p.g *= t;
	    p.b *= t;
	    p.a  = t;
	}
    }
}